

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O1

void __thiscall
psy::C::InternalsTestSuite::reparse
          (InternalsTestSuite *this,string *source,DisambiguationStrategy strategy,Expectation *X)

{
  unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *this_00;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  ulong uVar5;
  pointer pSVar6;
  ParseOptions parseOptions;
  int iVar7;
  SyntaxNode *pSVar8;
  ostream *poVar9;
  undefined8 uVar10;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar11;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  long *plVar12;
  _Alloc_hider _Var13;
  char *pcVar14;
  long *plVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char *pcVar17;
  char *pcVar18;
  iterator __end1;
  long lVar19;
  byte bVar20;
  iterator __begin1;
  pointer pSVar21;
  bool bVar22;
  string names;
  string textP;
  string namesP;
  string text;
  SyntaxNamePrinter printer;
  Unparser unparser;
  ParseOptions parseOpts;
  ostringstream ossTree;
  ostringstream ossText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  long *local_4f8;
  ulong local_4f0;
  long local_4e8 [2];
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  SyntaxNamePrinter local_498;
  long *local_470 [2];
  long local_460 [2];
  Unparser local_450;
  SourceText local_438;
  ParseOptions local_418;
  ParseOptions local_3f8;
  Expectation local_3d8;
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  SourceText local_1a8 [3];
  ios_base local_138 [264];
  
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  pcVar4 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,pcVar4,pcVar4 + source->_M_string_length);
  ParseOptions::ParseOptions(&local_418);
  if (strategy == TypeSynonymsVerification) {
    bVar20 = 1;
    ParseOptions::setAmbiguityMode(&local_418,DisambiguateAlgorithmically);
  }
  else if (strategy == SyntaxCorrelation) {
    bVar20 = 2;
    ParseOptions::setAmbiguityMode(&local_418,DisambiguateAlgorithmically);
  }
  else {
    if (strategy != GuidelineImposition) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tReason: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"unknown strategy",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x138);
      std::endl<char,std::char_traits<char>>(poVar9);
      uVar10 = __cxa_allocate_exception(1);
      __cxa_throw(uVar10,&TestFailed::typeinfo,0);
    }
    ParseOptions::setAmbiguityMode(&local_418,DisambiguateHeuristically);
    bVar20 = 0;
  }
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_4b8._M_dataplus._M_p,
             local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
  psy::SourceText::SourceText(&local_438,local_470);
  local_3f8.langExts_.field_1._0_4_ = local_418.langExts_.field_1.BF_all_._0_4_;
  local_3f8.langExts_.field_1._4_4_ = local_418.langExts_.field_1.BF_all_._4_4_;
  local_3f8.field_2 = local_418.field_2;
  local_3f8._26_2_ = local_418._26_2_;
  local_3f8._28_4_ = local_418._28_4_;
  local_3f8.langDialect_.std_ = local_418.langDialect_.std_;
  local_3f8._1_3_ = local_418._1_3_;
  local_3f8._4_4_ = local_418._4_4_;
  local_3f8.langExts_.translations_.field_0._0_4_ =
       local_418.langExts_.translations_.field_0.BF_all_._0_4_;
  local_3f8.langExts_.translations_.field_0._4_4_ =
       local_418.langExts_.translations_.field_0.BF_all_._4_4_;
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"");
  parseOptions._4_4_ = local_3f8._4_4_;
  parseOptions.langDialect_.std_ = local_3f8.langDialect_.std_;
  parseOptions._1_3_ = local_3f8._1_3_;
  parseOptions.langExts_.translations_.field_0.BF_all_._4_4_ =
       local_3f8.langExts_.translations_.field_0._4_4_;
  parseOptions.langExts_.translations_.field_0.BF_all_._0_4_ =
       local_3f8.langExts_.translations_.field_0._0_4_;
  parseOptions.langExts_.field_1.BF_all_._4_4_ = local_3f8.langExts_.field_1._4_4_;
  parseOptions.langExts_.field_1.BF_all_._0_4_ = local_3f8.langExts_.field_1._0_4_;
  parseOptions._28_4_ = local_3f8._28_4_;
  parseOptions.field_2 = local_3f8.field_2;
  parseOptions._26_2_ = local_3f8._26_2_;
  SyntaxTree::parseText
            (local_1a8,(TextPreprocessingState)&local_438,Unknown,parseOptions,
             (string *)(ulong)bVar20,(SyntaxCategory)local_320);
  _Var13._M_p = local_1a8[0].rawText_._M_dataplus._M_p;
  this_00 = &this->tree_;
  local_1a8[0].rawText_._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::reset
            ((__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)
             this_00,(pointer)_Var13._M_p);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_1a8);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.rawText_._M_dataplus._M_p != &local_438.rawText_.field_2) {
    operator_delete(local_438.rawText_._M_dataplus._M_p,
                    local_438.rawText_.field_2._M_allocated_capacity + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  if (X->containsAmbiguity_ == false) {
    Expectation::Expectation(&local_3d8,X);
    bVar22 = checkErrorAndWarn(this,&local_3d8);
    bVar22 = !bVar22;
    if (local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_3d8.declarations_);
    if (local_3d8.syntaxKinds_.
        super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.syntaxKinds_.
                      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d8.syntaxKinds_.
                            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.syntaxKinds_.
                            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.ambiguityText_._M_dataplus._M_p != &local_3d8.ambiguityText_.field_2) {
      operator_delete(local_3d8.ambiguityText_._M_dataplus._M_p,
                      local_3d8.ambiguityText_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d8.descriptorsW_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d8.descriptorsE_);
  }
  else {
    bVar22 = false;
  }
  if (bVar22) goto LAB_003fd27f;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  SyntaxVisitor::SyntaxVisitor
            ((SyntaxVisitor *)&local_498,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  local_498.super_SyntaxDumper.super_SyntaxVisitor._vptr_SyntaxVisitor =
       (_func_int **)&PTR__SyntaxNamePrinter_00509d20;
  local_498.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar8 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  SyntaxNamePrinter::print(&local_498,pSVar8,Plain,(ostream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  SyntaxVisitor::SyntaxVisitor
            ((SyntaxVisitor *)&local_450,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  local_450.super_SyntaxDumper.super_SyntaxVisitor._vptr_SyntaxVisitor =
       (_func_int **)&PTR__SyntaxVisitor_00537228;
  pSVar8 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  Unparser::unparse(&local_450,pSVar8,(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  plVar1 = (long *)((long)local_4f8 + local_4f0);
  plVar12 = local_4f8;
  if (0 < (long)local_4f0 >> 2) {
    plVar12 = (long *)((long)local_4f8 + (local_4f0 & 0xfffffffffffffffc));
    lVar19 = ((long)local_4f0 >> 2) + 1;
    plVar15 = (long *)((long)local_4f8 + 3);
    do {
      iVar7 = isspace((int)*(char *)((long)plVar15 + -3));
      if (iVar7 != 0) {
        plVar15 = (long *)((long)plVar15 + -3);
        goto LAB_003fca86;
      }
      iVar7 = isspace((int)*(char *)((long)plVar15 + -2));
      if (iVar7 != 0) {
        plVar15 = (long *)((long)plVar15 + -2);
        goto LAB_003fca86;
      }
      iVar7 = isspace((int)*(char *)((long)plVar15 + -1));
      if (iVar7 != 0) {
        plVar15 = (long *)((long)plVar15 + -1);
        goto LAB_003fca86;
      }
      iVar7 = isspace((int)(char)*plVar15);
      if (iVar7 != 0) goto LAB_003fca86;
      lVar19 = lVar19 + -1;
      plVar15 = (long *)((long)plVar15 + 4);
    } while (1 < lVar19);
  }
  lVar19 = (long)plVar1 - (long)plVar12;
  if (lVar19 == 1) {
LAB_003fca62:
    iVar7 = isspace((int)(char)*plVar12);
    plVar15 = plVar12;
    if (iVar7 == 0) {
      plVar15 = plVar1;
    }
  }
  else if (lVar19 == 2) {
LAB_003fca51:
    iVar7 = isspace((int)(char)*plVar12);
    plVar15 = plVar12;
    if (iVar7 == 0) {
      plVar12 = (long *)((long)plVar12 + 1);
      goto LAB_003fca62;
    }
  }
  else {
    plVar15 = plVar1;
    if ((lVar19 == 3) && (iVar7 = isspace((int)(char)*plVar12), plVar15 = plVar12, iVar7 == 0)) {
      plVar12 = (long *)((long)plVar12 + 1);
      goto LAB_003fca51;
    }
  }
LAB_003fca86:
  plVar12 = (long *)((long)plVar15 + 1);
  if (plVar12 != plVar1 && plVar15 != plVar1) {
    do {
      lVar19 = *plVar12;
      iVar7 = isspace((int)(char)lVar19);
      if (iVar7 == 0) {
        *(char *)plVar15 = (char)lVar19;
        plVar15 = (long *)((long)plVar15 + 1);
      }
      plVar12 = (long *)((long)plVar12 + 1);
    } while (plVar12 != plVar1);
  }
  local_4f0 = (long)plVar15 - (long)local_4f8;
  *(char *)plVar15 = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
  _Var13._M_p = local_4b8._M_dataplus._M_p;
  if (0 < (long)local_4b8._M_string_length >> 2) {
    _Var13._M_p = local_4b8._M_dataplus._M_p + (local_4b8._M_string_length & 0xfffffffffffffffc);
    lVar19 = ((long)local_4b8._M_string_length >> 2) + 1;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_4b8._M_dataplus._M_p + 3);
    do {
      iVar7 = isspace((int)paVar16->_M_local_buf[-3]);
      if (iVar7 != 0) {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + -3);
        goto LAB_003fcbab;
      }
      iVar7 = isspace((int)paVar16->_M_local_buf[-2]);
      if (iVar7 != 0) {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + -2);
        goto LAB_003fcbab;
      }
      iVar7 = isspace((int)paVar16->_M_local_buf[-1]);
      if (iVar7 != 0) {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + -1);
        goto LAB_003fcbab;
      }
      iVar7 = isspace((int)paVar16->_M_local_buf[0]);
      if (iVar7 != 0) goto LAB_003fcbab;
      lVar19 = lVar19 + -1;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar16->_M_local_buf + 4);
    } while (1 < lVar19);
  }
  lVar19 = (long)paVar2 - (long)_Var13._M_p;
  if (lVar19 == 1) {
LAB_003fcb87:
    iVar7 = isspace((int)*_Var13._M_p);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p;
    if (iVar7 == 0) {
      paVar16 = paVar2;
    }
  }
  else if (lVar19 == 2) {
LAB_003fcb76:
    iVar7 = isspace((int)*_Var13._M_p);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p;
    if (iVar7 == 0) {
      _Var13._M_p = _Var13._M_p + 1;
      goto LAB_003fcb87;
    }
  }
  else {
    paVar16 = paVar2;
    if ((lVar19 == 3) &&
       (iVar7 = isspace((int)*_Var13._M_p),
       paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var13._M_p, iVar7 == 0)) {
      _Var13._M_p = _Var13._M_p + 1;
      goto LAB_003fcb76;
    }
  }
LAB_003fcbab:
  pcVar17 = paVar16->_M_local_buf + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar17 != paVar2 && paVar16 != paVar2) {
    do {
      cVar3 = *pcVar17;
      iVar7 = isspace((int)cVar3);
      if (iVar7 == 0) {
        paVar16->_M_local_buf[0] = cVar3;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar16->_M_local_buf + 1);
      }
      pcVar17 = pcVar17 + 1;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar17 != paVar2);
  }
  local_4b8._M_string_length = (long)paVar16 - (long)local_4b8._M_dataplus._M_p;
  paVar16->_M_local_buf[0] = '\0';
  if (X->containsAmbiguity_ != true) {
    if ((local_4f0 == local_4b8._M_string_length) &&
       ((sVar11 = local_4f0, local_4f0 == 0 ||
        (iVar7 = bcmp(local_4f8,local_4b8._M_dataplus._M_p,local_4f0), sVar11 = extraout_RDX,
        iVar7 == 0)))) goto LAB_003fcfec;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_4f8,local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\tExpected: ",0xc);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
               ,99);
    iVar7 = 0x167;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
LAB_003fcf98:
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar7);
    std::endl<char,std::char_traits<char>>(poVar9);
LAB_003fcfaa:
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  uVar5 = (X->ambiguityText_)._M_string_length;
  if (uVar5 == 0) {
    std::operator+(&local_518,&local_4b8,&local_4b8);
    sVar11 = local_4f0;
    if (local_4f0 == local_518._M_string_length) {
      if (local_4f0 == 0) {
        bVar22 = true;
      }
      else {
        iVar7 = bcmp(local_4f8,local_518._M_dataplus._M_p,local_4f0);
        bVar22 = iVar7 == 0;
        sVar11 = extraout_RDX_00;
      }
    }
    else {
      bVar22 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                               local_518.field_2._M_local_buf[0]) + 1);
      sVar11 = extraout_RDX_02;
    }
    if (!bVar22) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_4f8,local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\tExpected: ",0xc);
      std::operator+(&local_518,&local_4b8,&local_4b8);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x15d);
      std::endl<char,std::char_traits<char>>(poVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,
                        CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                                 local_518.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_003fcfaa;
    }
  }
  else {
    pcVar18 = (X->ambiguityText_)._M_dataplus._M_p;
    pcVar17 = pcVar18 + uVar5;
    pcVar14 = pcVar18;
    if (0 < (long)uVar5 >> 2) {
      pcVar14 = pcVar18 + (uVar5 & 0xfffffffffffffffc);
      lVar19 = ((long)uVar5 >> 2) + 1;
      pcVar18 = pcVar18 + 3;
      do {
        iVar7 = isspace((int)pcVar18[-3]);
        if (iVar7 != 0) {
          pcVar18 = pcVar18 + -3;
          goto LAB_003fce53;
        }
        iVar7 = isspace((int)pcVar18[-2]);
        if (iVar7 != 0) {
          pcVar18 = pcVar18 + -2;
          goto LAB_003fce53;
        }
        iVar7 = isspace((int)pcVar18[-1]);
        if (iVar7 != 0) {
          pcVar18 = pcVar18 + -1;
          goto LAB_003fce53;
        }
        iVar7 = isspace((int)*pcVar18);
        if (iVar7 != 0) goto LAB_003fce53;
        lVar19 = lVar19 + -1;
        pcVar18 = pcVar18 + 4;
      } while (1 < lVar19);
    }
    lVar19 = (long)pcVar17 - (long)pcVar14;
    if (lVar19 == 1) {
LAB_003fccc9:
      iVar7 = isspace((int)*pcVar14);
      pcVar18 = pcVar14;
      if (iVar7 == 0) {
        pcVar18 = pcVar17;
      }
    }
    else if (lVar19 == 2) {
LAB_003fccb8:
      iVar7 = isspace((int)*pcVar14);
      pcVar18 = pcVar14;
      if (iVar7 == 0) {
        pcVar14 = pcVar14 + 1;
        goto LAB_003fccc9;
      }
    }
    else {
      pcVar18 = pcVar17;
      if ((lVar19 == 3) && (iVar7 = isspace((int)*pcVar14), pcVar18 = pcVar14, iVar7 == 0)) {
        pcVar14 = pcVar14 + 1;
        goto LAB_003fccb8;
      }
    }
LAB_003fce53:
    pcVar14 = pcVar18 + 1;
    if (pcVar14 != pcVar17 && pcVar18 != pcVar17) {
      do {
        cVar3 = *pcVar14;
        iVar7 = isspace((int)cVar3);
        if (iVar7 == 0) {
          *pcVar18 = cVar3;
          pcVar18 = pcVar18 + 1;
        }
        pcVar14 = pcVar14 + 1;
      } while (pcVar14 != pcVar17);
    }
    (X->ambiguityText_)._M_string_length =
         (long)pcVar18 - (long)(X->ambiguityText_)._M_dataplus._M_p;
    *pcVar18 = '\0';
    if ((local_4f0 != (X->ambiguityText_)._M_string_length) ||
       ((sVar11 = local_4f0, local_4f0 != 0 &&
        (iVar7 = bcmp(local_4f8,(X->ambiguityText_)._M_dataplus._M_p,local_4f0),
        sVar11 = extraout_RDX_01, iVar7 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_4f8,local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\tExpected: ",0xc);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(X->ambiguityText_)._M_dataplus._M_p,
                          (X->ambiguityText_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      iVar7 = 0x163;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
      goto LAB_003fcf98;
    }
  }
LAB_003fcfec:
  pSVar21 = (X->syntaxKinds_).
            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar6 = (X->syntaxKinds_).
           super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar21 != pSVar6) {
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    local_518._M_string_length = 0;
    local_518.field_2._M_local_buf[0] = '\0';
    do {
      to_string_abi_cxx11_(&local_4d8,(C *)(ulong)*pSVar21,(SyntaxKind)sVar11);
      std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_4d8._M_dataplus._M_p);
      sVar11 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        sVar11 = extraout_RDX_04;
      }
      pSVar21 = pSVar21 + 1;
    } while (pSVar21 != pSVar6);
    std::__cxx11::stringbuf::str();
    pcVar17 = local_4d8._M_dataplus._M_p + local_4d8._M_string_length;
    _Var13._M_p = local_4d8._M_dataplus._M_p;
    if (0 < (long)local_4d8._M_string_length >> 2) {
      _Var13._M_p = local_4d8._M_dataplus._M_p + (local_4d8._M_string_length & 0xfffffffffffffffc);
      lVar19 = ((long)local_4d8._M_string_length >> 2) + 1;
      pcVar18 = local_4d8._M_dataplus._M_p + 3;
      do {
        iVar7 = isspace((int)pcVar18[-3]);
        if (iVar7 != 0) {
          pcVar18 = pcVar18 + -3;
          goto LAB_003fd148;
        }
        iVar7 = isspace((int)pcVar18[-2]);
        if (iVar7 != 0) {
          pcVar18 = pcVar18 + -2;
          goto LAB_003fd148;
        }
        iVar7 = isspace((int)pcVar18[-1]);
        if (iVar7 != 0) {
          pcVar18 = pcVar18 + -1;
          goto LAB_003fd148;
        }
        iVar7 = isspace((int)*pcVar18);
        if (iVar7 != 0) goto LAB_003fd148;
        lVar19 = lVar19 + -1;
        pcVar18 = pcVar18 + 4;
      } while (1 < lVar19);
    }
    lVar19 = (long)pcVar17 - (long)_Var13._M_p;
    if (lVar19 == 1) {
LAB_003fd125:
      iVar7 = isspace((int)*_Var13._M_p);
      pcVar18 = _Var13._M_p;
      if (iVar7 == 0) {
        pcVar18 = pcVar17;
      }
    }
    else if (lVar19 == 2) {
LAB_003fd115:
      iVar7 = isspace((int)*_Var13._M_p);
      pcVar18 = _Var13._M_p;
      if (iVar7 == 0) {
        _Var13._M_p = _Var13._M_p + 1;
        goto LAB_003fd125;
      }
    }
    else {
      pcVar18 = pcVar17;
      if ((lVar19 == 3) && (iVar7 = isspace((int)*_Var13._M_p), pcVar18 = _Var13._M_p, iVar7 == 0))
      {
        _Var13._M_p = _Var13._M_p + 1;
        goto LAB_003fd115;
      }
    }
LAB_003fd148:
    pcVar14 = pcVar18 + 1;
    if (pcVar14 != pcVar17 && pcVar18 != pcVar17) {
      do {
        cVar3 = *pcVar14;
        iVar7 = isspace((int)cVar3);
        if (iVar7 == 0) {
          *pcVar18 = cVar3;
          pcVar18 = pcVar18 + 1;
        }
        pcVar14 = pcVar14 + 1;
      } while (pcVar14 != pcVar17);
    }
    _Var13._M_p = local_4d8._M_dataplus._M_p;
    local_4d8._M_string_length = (long)pcVar18 - (long)local_4d8._M_dataplus._M_p;
    *pcVar18 = '\0';
    if ((local_4d8._M_string_length != local_518._M_string_length) ||
       ((local_4d8._M_string_length != 0 &&
        (iVar7 = bcmp(local_4d8._M_dataplus._M_p,local_518._M_dataplus._M_p,
                      local_4d8._M_string_length), iVar7 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4d8._M_dataplus._M_p,
                          local_4d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\tExpected: ",0xc);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x172);
      std::endl<char,std::char_traits<char>>(poVar9);
      uVar10 = __cxa_allocate_exception(1);
      __cxa_throw(uVar10,&TestFailed::typeinfo,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != &local_4d8.field_2) {
      operator_delete(_Var13._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                               local_518.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&local_450);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_498.dump_.
      super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.dump_.
                    super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.dump_.
                          super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.dump_.
                          super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&local_498);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
LAB_003fd27f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InternalsTestSuite::reparse(std::string source,
                                 Reparser::DisambiguationStrategy strategy,
                                 Expectation X)
{
    auto text = source;

    ParseOptions parseOpts;
    TextCompleteness textCompleness;
    switch (strategy) {
        case Reparser::DisambiguationStrategy::SyntaxCorrelation:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Fragment;
            break;

        case Reparser::DisambiguationStrategy::TypeSynonymsVerification:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Full;
            break;

        case Reparser::DisambiguationStrategy::GuidelineImposition:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateHeuristically);
            textCompleness = TextCompleteness::Unknown;
            break;

        default:
            PSY__internals__FAIL("unknown strategy");
    }

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  textCompleness,
                                  parseOpts,
                                  "");

    if (!X.containsAmbiguity_ && !checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}